

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
cnn::Transpose::backward_impl
          (Transpose *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  uint uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  byte bVar6;
  byte bVar7;
  ulong uVar8;
  float *pfVar9;
  Index row;
  ulong uVar10;
  uint uVar11;
  ushort uVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  int iVar21;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_70;
  Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  local_50;
  
  if (((*(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>)._M_impl
         .super__Vector_impl_data._M_start)->d).bd != 0) {
    uVar11 = 0;
    auVar14 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar15 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      uVar1 = (dEdf->d).nd;
      iVar21 = 1;
      if ((ulong)uVar1 != 0) {
        auVar16 = vpbroadcastq_avx512f();
        uVar8 = 0;
        auVar17 = vpbroadcastd_avx512f(ZEXT416(1));
        do {
          auVar18 = vmovdqa64_avx512f(auVar17);
          auVar17 = vpbroadcastq_avx512f();
          auVar19 = vporq_avx512f(auVar17,auVar14);
          auVar17 = vporq_avx512f(auVar17,auVar15);
          uVar5 = vpcmpuq_avx512f(auVar17,auVar16,2);
          bVar6 = (byte)uVar5;
          uVar5 = vpcmpuq_avx512f(auVar19,auVar16,2);
          bVar7 = (byte)uVar5;
          uVar12 = CONCAT11(bVar7,bVar6);
          auVar17 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdf->d).d + uVar8));
          auVar19._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar17._4_4_;
          auVar19._0_4_ = (uint)(bVar6 & 1) * auVar17._0_4_;
          auVar19._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar17._8_4_;
          auVar19._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar17._12_4_;
          auVar19._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * auVar17._16_4_;
          auVar19._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * auVar17._20_4_;
          auVar19._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * auVar17._24_4_;
          auVar19._28_4_ = (uint)((byte)(uVar12 >> 7) & 1) * auVar17._28_4_;
          auVar19._32_4_ = (uint)(bVar7 & 1) * auVar17._32_4_;
          auVar19._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar17._36_4_;
          auVar19._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar17._40_4_;
          auVar19._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar17._44_4_;
          auVar19._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar17._48_4_;
          auVar19._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar17._52_4_;
          auVar19._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar17._56_4_;
          auVar19._60_4_ = (uint)(bVar7 >> 7) * auVar17._60_4_;
          auVar17 = vpmulld_avx512f(auVar19,auVar18);
          uVar8 = uVar8 + 0x10;
        } while (((ulong)uVar1 + 0xf & 0x1fffffff0) != uVar8);
        auVar16 = vmovdqa32_avx512f(auVar17);
        auVar17._0_4_ = (uint)(bVar6 & 1) * auVar16._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar18._0_4_
        ;
        bVar2 = (bool)((byte)(uVar12 >> 1) & 1);
        auVar17._4_4_ = (uint)bVar2 * auVar16._4_4_ | (uint)!bVar2 * auVar18._4_4_;
        bVar2 = (bool)((byte)(uVar12 >> 2) & 1);
        auVar17._8_4_ = (uint)bVar2 * auVar16._8_4_ | (uint)!bVar2 * auVar18._8_4_;
        bVar2 = (bool)((byte)(uVar12 >> 3) & 1);
        auVar17._12_4_ = (uint)bVar2 * auVar16._12_4_ | (uint)!bVar2 * auVar18._12_4_;
        bVar2 = (bool)((byte)(uVar12 >> 4) & 1);
        auVar17._16_4_ = (uint)bVar2 * auVar16._16_4_ | (uint)!bVar2 * auVar18._16_4_;
        bVar2 = (bool)((byte)(uVar12 >> 5) & 1);
        auVar17._20_4_ = (uint)bVar2 * auVar16._20_4_ | (uint)!bVar2 * auVar18._20_4_;
        bVar2 = (bool)((byte)(uVar12 >> 6) & 1);
        auVar17._24_4_ = (uint)bVar2 * auVar16._24_4_ | (uint)!bVar2 * auVar18._24_4_;
        bVar2 = (bool)((byte)(uVar12 >> 7) & 1);
        auVar17._28_4_ = (uint)bVar2 * auVar16._28_4_ | (uint)!bVar2 * auVar18._28_4_;
        auVar17._32_4_ =
             (uint)(bVar7 & 1) * auVar16._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar18._32_4_;
        bVar2 = (bool)(bVar7 >> 1 & 1);
        auVar17._36_4_ = (uint)bVar2 * auVar16._36_4_ | (uint)!bVar2 * auVar18._36_4_;
        bVar2 = (bool)(bVar7 >> 2 & 1);
        auVar17._40_4_ = (uint)bVar2 * auVar16._40_4_ | (uint)!bVar2 * auVar18._40_4_;
        bVar2 = (bool)(bVar7 >> 3 & 1);
        auVar17._44_4_ = (uint)bVar2 * auVar16._44_4_ | (uint)!bVar2 * auVar18._44_4_;
        bVar2 = (bool)(bVar7 >> 4 & 1);
        auVar17._48_4_ = (uint)bVar2 * auVar16._48_4_ | (uint)!bVar2 * auVar18._48_4_;
        bVar2 = (bool)(bVar7 >> 5 & 1);
        auVar17._52_4_ = (uint)bVar2 * auVar16._52_4_ | (uint)!bVar2 * auVar18._52_4_;
        bVar2 = (bool)(bVar7 >> 6 & 1);
        auVar17._56_4_ = (uint)bVar2 * auVar16._56_4_ | (uint)!bVar2 * auVar18._56_4_;
        auVar17._60_4_ =
             (uint)(bVar7 >> 7) * auVar16._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar18._60_4_;
        auVar13 = vextracti64x4_avx512f(auVar17,1);
        auVar16 = vpmulld_avx512f(auVar17,ZEXT3264(auVar13));
        auVar3 = vpmulld_avx(auVar16._0_16_,auVar16._16_16_);
        auVar4 = vpshufd_avx(auVar3,0xee);
        auVar3 = vpmulld_avx(auVar3,auVar4);
        auVar4 = vpshufd_avx(auVar3,0x55);
        auVar3 = vpmulld_avx(auVar3,auVar4);
        iVar21 = auVar3._0_4_;
      }
      local_50.m_matrix.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = dEdf->v + (uVar11 % (dEdf->d).bd) * iVar21;
      local_50.m_matrix.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value = (long)(dEdf->d).d[0];
      iVar21 = 1;
      local_50.m_matrix.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value = (long)(dEdf->d).d[1];
      if (uVar1 < 2) {
        local_50.m_matrix.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value = 1;
      }
      uVar1 = (dEdxi->d).nd;
      if ((ulong)uVar1 != 0) {
        auVar16 = vpbroadcastq_avx512f();
        uVar8 = 0;
        auVar17 = vpbroadcastd_avx512f(ZEXT416(1));
        do {
          auVar18 = vmovdqa64_avx512f(auVar17);
          auVar17 = vpbroadcastq_avx512f();
          auVar19 = vporq_avx512f(auVar17,auVar14);
          auVar17 = vporq_avx512f(auVar17,auVar15);
          uVar5 = vpcmpuq_avx512f(auVar17,auVar16,2);
          bVar6 = (byte)uVar5;
          uVar5 = vpcmpuq_avx512f(auVar19,auVar16,2);
          bVar7 = (byte)uVar5;
          uVar12 = CONCAT11(bVar7,bVar6);
          auVar17 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdxi->d).d + uVar8));
          auVar20._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar17._4_4_;
          auVar20._0_4_ = (uint)(bVar6 & 1) * auVar17._0_4_;
          auVar20._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar17._8_4_;
          auVar20._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar17._12_4_;
          auVar20._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * auVar17._16_4_;
          auVar20._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * auVar17._20_4_;
          auVar20._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * auVar17._24_4_;
          auVar20._28_4_ = (uint)((byte)(uVar12 >> 7) & 1) * auVar17._28_4_;
          auVar20._32_4_ = (uint)(bVar7 & 1) * auVar17._32_4_;
          auVar20._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar17._36_4_;
          auVar20._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar17._40_4_;
          auVar20._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar17._44_4_;
          auVar20._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar17._48_4_;
          auVar20._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar17._52_4_;
          auVar20._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar17._56_4_;
          auVar20._60_4_ = (uint)(bVar7 >> 7) * auVar17._60_4_;
          auVar17 = vpmulld_avx512f(auVar20,auVar18);
          uVar8 = uVar8 + 0x10;
        } while (((ulong)uVar1 + 0xf & 0x1fffffff0) != uVar8);
        auVar14 = vmovdqa32_avx512f(auVar17);
        auVar15._0_4_ = (uint)(bVar6 & 1) * auVar14._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar18._0_4_
        ;
        bVar2 = (bool)((byte)(uVar12 >> 1) & 1);
        auVar15._4_4_ = (uint)bVar2 * auVar14._4_4_ | (uint)!bVar2 * auVar18._4_4_;
        bVar2 = (bool)((byte)(uVar12 >> 2) & 1);
        auVar15._8_4_ = (uint)bVar2 * auVar14._8_4_ | (uint)!bVar2 * auVar18._8_4_;
        bVar2 = (bool)((byte)(uVar12 >> 3) & 1);
        auVar15._12_4_ = (uint)bVar2 * auVar14._12_4_ | (uint)!bVar2 * auVar18._12_4_;
        bVar2 = (bool)((byte)(uVar12 >> 4) & 1);
        auVar15._16_4_ = (uint)bVar2 * auVar14._16_4_ | (uint)!bVar2 * auVar18._16_4_;
        bVar2 = (bool)((byte)(uVar12 >> 5) & 1);
        auVar15._20_4_ = (uint)bVar2 * auVar14._20_4_ | (uint)!bVar2 * auVar18._20_4_;
        bVar2 = (bool)((byte)(uVar12 >> 6) & 1);
        auVar15._24_4_ = (uint)bVar2 * auVar14._24_4_ | (uint)!bVar2 * auVar18._24_4_;
        bVar2 = (bool)((byte)(uVar12 >> 7) & 1);
        auVar15._28_4_ = (uint)bVar2 * auVar14._28_4_ | (uint)!bVar2 * auVar18._28_4_;
        auVar15._32_4_ =
             (uint)(bVar7 & 1) * auVar14._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar18._32_4_;
        bVar2 = (bool)(bVar7 >> 1 & 1);
        auVar15._36_4_ = (uint)bVar2 * auVar14._36_4_ | (uint)!bVar2 * auVar18._36_4_;
        bVar2 = (bool)(bVar7 >> 2 & 1);
        auVar15._40_4_ = (uint)bVar2 * auVar14._40_4_ | (uint)!bVar2 * auVar18._40_4_;
        bVar2 = (bool)(bVar7 >> 3 & 1);
        auVar15._44_4_ = (uint)bVar2 * auVar14._44_4_ | (uint)!bVar2 * auVar18._44_4_;
        bVar2 = (bool)(bVar7 >> 4 & 1);
        auVar15._48_4_ = (uint)bVar2 * auVar14._48_4_ | (uint)!bVar2 * auVar18._48_4_;
        bVar2 = (bool)(bVar7 >> 5 & 1);
        auVar15._52_4_ = (uint)bVar2 * auVar14._52_4_ | (uint)!bVar2 * auVar18._52_4_;
        bVar2 = (bool)(bVar7 >> 6 & 1);
        auVar15._56_4_ = (uint)bVar2 * auVar14._56_4_ | (uint)!bVar2 * auVar18._56_4_;
        auVar15._60_4_ =
             (uint)(bVar7 >> 7) * auVar14._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar18._60_4_;
        auVar13 = vextracti64x4_avx512f(auVar15,1);
        auVar14 = vpmulld_avx512f(auVar15,ZEXT3264(auVar13));
        auVar3 = vpmulld_avx(auVar14._0_16_,auVar14._16_16_);
        auVar4 = vpshufd_avx(auVar3,0xee);
        auVar3 = vpmulld_avx(auVar3,auVar4);
        auVar4 = vpshufd_avx(auVar3,0x55);
        auVar3 = vpmulld_avx(auVar3,auVar4);
        iVar21 = auVar3._0_4_;
      }
      local_70.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = dEdxi->v + (uVar11 % (dEdxi->d).bd) * iVar21;
      local_70.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value = (long)(dEdxi->d).d[0];
      local_70.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value = (long)(dEdxi->d).d[1];
      if (uVar1 < 2) {
        local_70.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value = 1;
      }
      Eigen::internal::
      check_for_aliasing<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>const>>
                (&local_70,&local_50);
      if ((local_70.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value !=
           local_50.m_matrix.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_cols.m_value) ||
         (local_70.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value !=
          local_50.m_matrix.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_rows.m_value)) {
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, -1>>, SrcXprType = Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
                     );
      }
      auVar14 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar15 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      if (0 < local_70.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_cols.m_value) {
        uVar8 = 0;
        do {
          if (0 < local_70.
                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                  .
                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  .m_rows.m_value) {
            uVar10 = 0;
            pfVar9 = local_50.m_matrix.
                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                     .
                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                     .m_data;
            do {
              local_70.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data[uVar10] =
                   local_70.
                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   .
                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                   .m_data[uVar10] + *pfVar9;
              uVar10 = uVar10 + 1;
              pfVar9 = pfVar9 + local_50.m_matrix.
                                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                .
                                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                .m_rows.m_value;
            } while (local_70.
                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                     .
                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                     .m_rows.m_value != uVar10);
          }
          uVar8 = uVar8 + 1;
          local_50.m_matrix.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data = local_50.m_matrix.
                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                    .
                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                    .m_data + 1;
          local_70.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data = local_70.
                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                    .
                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                    .m_data + local_70.
                              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                              .
                              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                              .m_rows.m_value;
        } while (uVar8 != local_70.
                          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                          .
                          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                          .m_cols.m_value);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < ((*(xs->
                         super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                         )._M_impl.super__Vector_impl_data._M_start)->d).bd);
  }
  return;
}

Assistant:

void Identity::backward_impl(const vector<const Tensor*>& xs,
                  const Tensor& fx,
                  const Tensor& dEdf,
                  unsigned i,
                  Tensor& dEdxi) const {
  *dEdxi += *dEdf;
}